

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O1

void __thiscall
QtPrivate::QGenericArrayOps<OrderedScreen>::copyAppend
          (QGenericArrayOps<OrderedScreen> *this,OrderedScreen *b,OrderedScreen *e)

{
  qsizetype *pqVar1;
  OrderedScreen *pOVar2;
  long lVar3;
  undefined8 uVar4;
  Data *pDVar5;
  Data *pDVar6;
  Data *pDVar7;
  qreal qVar8;
  qreal qVar9;
  drmModePropertyPtr p_Var10;
  drmModePropertyBlobPtr p_Var11;
  QKmsPlane *pQVar12;
  QSize QVar13;
  OrderedScreen *pOVar14;
  Representation RVar15;
  int iVar16;
  bool bVar17;
  undefined7 uVar18;
  uint32_t uVar19;
  uint32_t uVar20;
  uint32_t uVar21;
  undefined4 uVar22;
  undefined3 uVar23;
  bool bVar24;
  bool bVar25;
  undefined3 uVar26;
  
  if ((b != e) && (b < e)) {
    pOVar2 = (this->super_QArrayDataPointer<OrderedScreen>).ptr;
    do {
      lVar3 = (this->super_QArrayDataPointer<OrderedScreen>).size;
      pOVar2[lVar3].screen = b->screen;
      RVar15.m_i = (b->vinfo).virtualPos.xp.m_i;
      uVar4 = *(undefined8 *)((long)&(b->vinfo).virtualPos.xp.m_i + 1);
      pOVar2[lVar3].vinfo.virtualIndex = (b->vinfo).virtualIndex;
      pOVar2[lVar3].vinfo.virtualPos.xp = (Representation)RVar15.m_i;
      *(undefined8 *)((long)&pOVar2[lVar3].vinfo.virtualPos.xp.m_i + 1) = uVar4;
      pDVar5 = (b->vinfo).output.name.d.d;
      pOVar2[lVar3].vinfo.output.name.d.d = pDVar5;
      pOVar2[lVar3].vinfo.output.name.d.ptr = (b->vinfo).output.name.d.ptr;
      pOVar2[lVar3].vinfo.output.name.d.size = (b->vinfo).output.name.d.size;
      if (pDVar5 != (Data *)0x0) {
        LOCK();
        (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int> =
             (__atomic_base<int>)
             ((__int_type)(pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int> + 1);
        UNLOCK();
      }
      pOVar2[lVar3].vinfo.output.saved_crtc = (b->vinfo).output.saved_crtc;
      uVar19 = (b->vinfo).output.connector_id;
      uVar20 = (b->vinfo).output.crtc_index;
      uVar21 = (b->vinfo).output.crtc_id;
      uVar22 = *(undefined4 *)&(b->vinfo).output.field_0x24;
      qVar8 = (b->vinfo).output.physical_size.wd;
      qVar9 = (b->vinfo).output.physical_size.ht;
      iVar16 = (b->vinfo).output.mode;
      bVar17 = (b->vinfo).output.mode_set;
      uVar18 = *(undefined7 *)&(b->vinfo).output.field_0x41;
      pOVar2[lVar3].vinfo.output.preferred_mode = (b->vinfo).output.preferred_mode;
      pOVar2[lVar3].vinfo.output.mode = iVar16;
      pOVar2[lVar3].vinfo.output.mode_set = bVar17;
      *(undefined7 *)&pOVar2[lVar3].vinfo.output.field_0x41 = uVar18;
      pOVar2[lVar3].vinfo.output.physical_size.wd = qVar8;
      pOVar2[lVar3].vinfo.output.physical_size.ht = qVar9;
      pOVar2[lVar3].vinfo.output.connector_id = uVar19;
      pOVar2[lVar3].vinfo.output.crtc_index = uVar20;
      pOVar2[lVar3].vinfo.output.crtc_id = uVar21;
      *(undefined4 *)&pOVar2[lVar3].vinfo.output.field_0x24 = uVar22;
      pDVar6 = (b->vinfo).output.modes.d.d;
      pOVar2[lVar3].vinfo.output.modes.d.d = pDVar6;
      pOVar2[lVar3].vinfo.output.modes.d.ptr = (b->vinfo).output.modes.d.ptr;
      pOVar2[lVar3].vinfo.output.modes.d.size = (b->vinfo).output.modes.d.size;
      if (pDVar6 != (Data *)0x0) {
        LOCK();
        (pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar6->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      iVar16 = (b->vinfo).output.subpixel;
      uVar22 = *(undefined4 *)&(b->vinfo).output.field_0x6c;
      p_Var10 = (b->vinfo).output.dpms_prop;
      p_Var11 = (b->vinfo).output.edid_blob;
      bVar25 = (b->vinfo).output.wants_forced_plane;
      uVar26 = *(undefined3 *)&(b->vinfo).output.field_0x81;
      uVar21 = (b->vinfo).output.forced_plane_id;
      uVar19 = (b->vinfo).output.forced_plane_id;
      bVar17 = (b->vinfo).output.forced_plane_set;
      uVar23 = *(undefined3 *)&(b->vinfo).output.field_0x89;
      uVar20 = (b->vinfo).output.drm_format;
      bVar24 = (b->vinfo).output.drm_format_requested_by_user;
      pOVar14 = pOVar2 + lVar3;
      *(undefined3 *)&(pOVar14->vinfo).output.field_0x81 =
           *(undefined3 *)&(b->vinfo).output.field_0x81;
      (pOVar14->vinfo).output.forced_plane_id = uVar19;
      (pOVar14->vinfo).output.forced_plane_set = bVar17;
      pOVar14 = pOVar2 + lVar3;
      *(undefined3 *)&(pOVar14->vinfo).output.field_0x89 = uVar23;
      (pOVar14->vinfo).output.drm_format = uVar20;
      (pOVar14->vinfo).output.drm_format_requested_by_user = bVar24;
      pOVar2[lVar3].vinfo.output.edid_blob = p_Var11;
      pOVar14 = pOVar2 + lVar3;
      (pOVar14->vinfo).output.wants_forced_plane = bVar25;
      *(undefined3 *)&(pOVar14->vinfo).output.field_0x81 = uVar26;
      (pOVar14->vinfo).output.forced_plane_id = uVar21;
      pOVar2[lVar3].vinfo.output.subpixel = iVar16;
      *(undefined4 *)&pOVar2[lVar3].vinfo.output.field_0x6c = uVar22;
      pOVar2[lVar3].vinfo.output.dpms_prop = p_Var10;
      pDVar5 = (b->vinfo).output.clone_source.d.d;
      pOVar2[lVar3].vinfo.output.clone_source.d.d = pDVar5;
      pOVar2[lVar3].vinfo.output.clone_source.d.ptr = (b->vinfo).output.clone_source.d.ptr;
      pOVar2[lVar3].vinfo.output.clone_source.d.size = (b->vinfo).output.clone_source.d.size;
      if (pDVar5 != (Data *)0x0) {
        LOCK();
        (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar5->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      pDVar7 = (b->vinfo).output.available_planes.d.d;
      pOVar2[lVar3].vinfo.output.available_planes.d.d = pDVar7;
      pOVar2[lVar3].vinfo.output.available_planes.d.ptr = (b->vinfo).output.available_planes.d.ptr;
      pOVar2[lVar3].vinfo.output.available_planes.d.size = (b->vinfo).output.available_planes.d.size
      ;
      if (pDVar7 != (Data *)0x0) {
        LOCK();
        (pDVar7->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar7->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      pQVar12 = (b->vinfo).output.eglfs_plane;
      QVar13 = (b->vinfo).output.size;
      uVar19 = (b->vinfo).output.modeIdPropertyId;
      uVar20 = (b->vinfo).output.activePropertyId;
      uVar21 = (b->vinfo).output.mode_blob_id;
      pOVar2[lVar3].vinfo.output.crtcIdPropertyId = (b->vinfo).output.crtcIdPropertyId;
      pOVar2[lVar3].vinfo.output.modeIdPropertyId = uVar19;
      pOVar2[lVar3].vinfo.output.activePropertyId = uVar20;
      pOVar2[lVar3].vinfo.output.mode_blob_id = uVar21;
      pOVar2[lVar3].vinfo.output.eglfs_plane = pQVar12;
      pOVar2[lVar3].vinfo.output.size = QVar13;
      b = b + 1;
      pqVar1 = &(this->super_QArrayDataPointer<OrderedScreen>).size;
      *pqVar1 = *pqVar1 + 1;
    } while (b < e);
  }
  return;
}

Assistant:

void copyAppend(const T *b, const T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e) // short-cut and handling the case b and e == nullptr
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(*b);
            ++b;
            ++this->size;
        }
    }